

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_Date_UTC(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  JSContext *in_RDI;
  double dVar3;
  JSValue JVar4;
  double a;
  int n;
  int i;
  double fields [7];
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValue v;
  double local_d8;
  int local_d0;
  int local_cc;
  double *in_stack_ffffffffffffff38;
  JSContext *in_stack_ffffffffffffff40;
  JSValueUnion JVar5;
  int64_t in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  double *in_stack_ffffffffffffff60;
  int32_t local_68;
  undefined4 uStack_64;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 uStack_44;
  JSValueUnion local_10;
  int64_t local_8;
  
  memset(&stack0xffffffffffffff38,0,0x38);
  JVar5.float64 = 1.0;
  if (in_ECX == 0) {
    local_68 = 0;
    uStack_64 = 0x7ff80000;
    local_60 = 7;
  }
  else {
    local_d0 = in_ECX;
    if (7 < in_ECX) {
      local_d0 = 7;
    }
    for (local_cc = 0; local_cc < local_d0; local_cc = local_cc + 1) {
      JVar4.tag = in_stack_ffffffffffffff50;
      JVar4.u.float64 = JVar5.float64;
      iVar2 = JS_ToFloat64(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,JVar4);
      if (iVar2 != 0) {
        local_68 = 0;
        local_60 = 6;
        goto LAB_0018a0d0;
      }
      if (0x7fefffffffffffff < (ulong)ABS(local_d8)) {
        local_68 = 0;
        uStack_64 = 0x7ff80000;
        local_60 = 7;
        goto LAB_0018a0d0;
      }
      dVar3 = trunc(local_d8);
      *(double *)(&stack0xffffffffffffff38 + (long)local_cc * 8) = dVar3;
      if (local_cc == 0) {
        if ((0.0 <= (double)in_stack_ffffffffffffff38) &&
           ((double)in_stack_ffffffffffffff38 < 100.0)) {
          in_stack_ffffffffffffff38 = (double *)((double)in_stack_ffffffffffffff38 + 1900.0);
        }
      }
    }
    dVar3 = set_date_fields(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (dVar3 == (double)(int)dVar3) {
      local_10._4_4_ = uStack_44;
      local_10.int32 = (int)dVar3;
      local_8 = 0;
    }
    else {
      JVar4 = __JS_NewFloat64(in_RDI,dVar3);
      local_58 = JVar4.u;
      local_10 = local_58;
      local_50 = JVar4.tag;
      local_8 = local_50;
    }
    local_68 = local_10.int32;
    uStack_64 = local_10._4_4_;
    local_60 = local_8;
  }
LAB_0018a0d0:
  JVar1.u._4_4_ = uStack_64;
  JVar1.u.int32 = local_68;
  JVar1.tag = local_60;
  return JVar1;
}

Assistant:

static JSValue js_Date_UTC(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    // UTC(y, mon, d, h, m, s, ms)
    double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
    int i, n;
    double a;

    n = argc;
    if (n == 0)
        return JS_NAN;
    if (n > 7)
        n = 7;
    for(i = 0; i < n; i++) {
        if (JS_ToFloat64(ctx, &a, argv[i]))
            return JS_EXCEPTION;
        if (!isfinite(a))
            return JS_NAN;
        fields[i] = trunc(a);
        if (i == 0 && fields[0] >= 0 && fields[0] < 100)
            fields[0] += 1900;
    }
    return JS_NewFloat64(ctx, set_date_fields(fields, 0));
}